

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamical-system-simulator.cpp
# Opt level: O1

Vector __thiscall
stateObservation::DynamicalSystemSimulator::getCurrentState(DynamicalSystemSimulator *this)

{
  uint uVar1;
  uint uVar2;
  DenseStorage<double,__1,__1,__1,_0> *other;
  long lVar3;
  Index extraout_RDX;
  long in_RSI;
  Vector VVar4;
  DenseStorage<double,__1,__1,__1,_0> local_28;
  
  uVar1 = *(uint *)(in_RSI + 0x10);
  lVar3 = (*(long *)(in_RSI + 0x38) - *(long *)(in_RSI + 0x28) >> 3) * -0x5555555555555555 +
          (*(long *)(in_RSI + 0x48) - *(long *)(in_RSI + 0x50) >> 3) * -0x5555555555555555 +
          ((*(long *)(in_RSI + 0x60) - *(long *)(in_RSI + 0x40) >> 3) + -1 +
          (ulong)(*(long *)(in_RSI + 0x60) == 0)) * 0x15;
  uVar2 = (uVar1 - 1) + (int)lVar3;
  if (((lVar3 != 0) && (uVar1 <= uVar2)) && ((ulong)uVar2 < lVar3 + (ulong)uVar1)) {
    other = (DenseStorage<double,__1,__1,__1,_0> *)
            std::
            _Deque_iterator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_&,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_*>
            ::operator[]((_Deque_iterator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_&,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_*>
                          *)(in_RSI + 0x28),(ulong)(uVar2 - uVar1));
    Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage(&local_28,other);
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
    PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)this,
               (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&local_28);
    free(local_28.m_data);
    VVar4.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
         extraout_RDX;
    VVar4.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
         (double *)this;
    return (Vector)VVar4.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage;
  }
  __assert_fail("checkIndex(time) && \"Error: Time out of range\"",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/stack-of-tasks[P]state-observation/include/state-observation/tools/definitions.hxx"
                ,0x9b,"void stateObservation::IndexedMatrixArray::check_(unsigned int) const");
}

Assistant:

Vector DynamicalSystemSimulator::getCurrentState() const
    {
        return x_[x_.getLastIndex()];
    }